

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O0

void __thiscall xLearn::MODEL_TEST_BestModel_Test::TestBody(MODEL_TEST_BestModel_Test *this)

{
  uint uVar1;
  bool bVar2;
  index_t iVar3;
  char *pcVar4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  index_t i_5;
  AssertionResult gtest_ar;
  index_t i_4;
  index_t i_3;
  index_t i_2;
  index_t i_1;
  index_t i;
  real_t *b;
  real_t *v;
  real_t *w;
  Model model_ffm;
  HyperParam hyper_param;
  HyperParam *in_stack_fffffffffffffc00;
  AssertHelper local_370;
  Message local_368;
  AssertionResult local_360;
  AssertHelper local_350;
  Message local_348;
  AssertionResult local_340;
  AssertHelper local_330;
  Message local_328;
  AssertionResult local_320;
  uint local_30c;
  AssertHelper local_308;
  Message local_300;
  AssertionResult local_2f8;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  real_t *local_2d0;
  real_t *local_2c8;
  real_t *local_2c0;
  Model *in_stack_fffffffffffffd60;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  Init();
  Model::Model((Model *)in_stack_fffffffffffffc00);
  Model::Initialize((Model *)model_ffm.param_best_b_,(string *)model_ffm.param_best_v_,
                    (string *)model_ffm.param_best_w_,model_ffm.param_b_._4_4_,
                    (index_t)model_ffm.param_b_,model_ffm.param_v_._4_4_,hyper_param._0_4_,
                    model_ffm.param_v_._0_4_);
  local_2c0 = Model::GetParameter_w((Model *)&stack0xfffffffffffffd58);
  local_2c8 = Model::GetParameter_v((Model *)&stack0xfffffffffffffd58);
  local_2d0 = Model::GetParameter_b((Model *)&stack0xfffffffffffffd58);
  for (local_2d4 = 0; uVar1 = local_2d4,
      iVar3 = Model::GetNumParameter_w((Model *)&stack0xfffffffffffffd58), uVar1 < iVar3;
      local_2d4 = local_2d4 + 1) {
    local_2c0[local_2d4] = 1.0;
  }
  for (local_2d8 = 0; uVar1 = local_2d8,
      iVar3 = Model::GetNumParameter_v((Model *)&stack0xfffffffffffffd58), uVar1 < iVar3;
      local_2d8 = local_2d8 + 1) {
    local_2c8[local_2d8] = 2.0;
  }
  *local_2d0 = 3.0;
  local_2d0[1] = 3.0;
  Model::SetBestModel(in_stack_fffffffffffffd60);
  for (local_2dc = 0; uVar1 = local_2dc,
      iVar3 = Model::GetNumParameter_w((Model *)&stack0xfffffffffffffd58), uVar1 < iVar3;
      local_2dc = local_2dc + 1) {
    local_2c0[local_2dc] = 0.0;
  }
  for (local_2e0 = 0; uVar1 = local_2e0,
      iVar3 = Model::GetNumParameter_v((Model *)&stack0xfffffffffffffd58), uVar1 < iVar3;
      local_2e0 = local_2e0 + 1) {
    local_2c8[local_2e0] = 0.0;
  }
  *local_2d0 = 0.0;
  local_2d0[1] = 0.0;
  Model::Shrink((Model *)in_stack_fffffffffffffc00);
  for (local_2e4 = 0; uVar1 = local_2e4,
      iVar3 = Model::GetNumParameter_w((Model *)&stack0xfffffffffffffd58), uVar1 < iVar3;
      local_2e4 = local_2e4 + 1) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
    if (!bVar2) {
      testing::Message::Message(&local_300);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x141172);
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x10f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_308,&local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      testing::Message::~Message((Message *)0x1411cf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x141224);
  }
  for (local_30c = 0; uVar1 = local_30c,
      iVar3 = Model::GetNumParameter_v((Model *)&stack0xfffffffffffffd58), uVar1 < iVar3;
      local_30c = local_30c + 1) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_320);
    if (!bVar2) {
      testing::Message::Message(&local_328);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x141315);
      testing::internal::AssertHelper::AssertHelper
                (&local_330,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x112,pcVar4);
      testing::internal::AssertHelper::operator=(&local_330,&local_328);
      testing::internal::AssertHelper::~AssertHelper(&local_330);
      testing::Message::~Message((Message *)0x141372);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1413c7);
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar2) {
    testing::Message::Message(&local_348);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x141477);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x114,pcVar4);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message((Message *)0x1414d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x141529);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!bVar2) {
    testing::Message::Message(&local_368);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1415c4);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x115,pcVar4);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::Message::~Message((Message *)0x141621);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x141676);
  Model::~Model((Model *)in_stack_fffffffffffffc00);
  HyperParam::~HyperParam(in_stack_fffffffffffffc00);
  return;
}

Assistant:

TEST(MODEL_TEST, BestModel) {
  // Init model
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 2);
  real_t* w = model_ffm.GetParameter_w();
  real_t* v = model_ffm.GetParameter_v();
  real_t* b = model_ffm.GetParameter_b();
  // Set best model
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    w[i] = 1;
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    v[i] = 2;
  }
  b[0] = 3;
  b[1] = 3;
  model_ffm.SetBestModel();
  // Shrink bacj
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    w[i] = 0;
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    v[i] = 0;
  }
  b[0] = 0;
  b[1] = 0;
  model_ffm.Shrink();
  // Test
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    EXPECT_FLOAT_EQ(w[i], 1);
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    EXPECT_FLOAT_EQ(v[i], 2);
  }
  EXPECT_FLOAT_EQ(b[0], 3);
  EXPECT_FLOAT_EQ(b[1], 3);
}